

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

void __thiscall
pbrt::PiecewiseLinear2D<0UL>::PiecewiseLinear2D
          (PiecewiseLinear2D<0UL> *this,memory_resource *alloc,long data,uint xSize,int ySize,
          char param_6,char param_7)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  size_t i;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  bool bVar11;
  ulong uVar12;
  float *pfVar13;
  long lVar14;
  uint32_t y_1;
  ulong uVar15;
  int y;
  float *pfVar16;
  float *pfVar17;
  long lVar18;
  ulong count;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_ZMM1 [64];
  float fVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float *local_88;
  polymorphic_allocator<float> local_78;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_70 [2];
  
  auVar20 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x = xSize;
  (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y = ySize;
  auVar21 = vpinsrd_avx(ZEXT416(xSize),ySize,1);
  auVar20 = vpaddd_avx(auVar21,auVar20);
  auVar21._8_4_ = 0x3f800000;
  auVar21._0_8_ = 0x3f8000003f800000;
  auVar21._12_4_ = 0x3f800000;
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vdivps_avx(auVar21,auVar20);
  auVar20 = vmovlhps_avx(auVar21,auVar20);
  this->m_patch_size = (Vector2f)auVar20._0_8_;
  this->m_inv_patch_size = (Vector2f)auVar20._8_8_;
  auVar20 = ZEXT816(0) << 0x20;
  (this->m_param_values).alloc.memoryResource = alloc;
  (this->m_param_values).nStored = 0;
  (this->m_param_values).ptr =
       (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)auVar20._0_8_;
  (this->m_param_values).nAlloc = auVar20._8_8_;
  (this->m_data).alloc.memoryResource = alloc;
  (this->m_data).ptr = (float *)auVar20._0_8_;
  (this->m_data).nAlloc = auVar20._8_8_;
  (this->m_data).nStored = 0;
  (this->m_marginal_cdf).alloc.memoryResource = alloc;
  (this->m_marginal_cdf).ptr = (float *)auVar20._0_8_;
  (this->m_marginal_cdf).nAlloc = auVar20._8_8_;
  (this->m_marginal_cdf).nStored = 0;
  (this->m_conditional_cdf).alloc.memoryResource = alloc;
  (this->m_conditional_cdf).nStored = 0;
  (this->m_conditional_cdf).ptr = (float *)auVar20._0_8_;
  (this->m_conditional_cdf).nAlloc = auVar20._8_8_;
  if (param_7 != '\x01' || param_6 != '\0') {
    count = (ulong)(ySize * xSize);
    local_78.memoryResource = pstd::pmr::new_delete_resource();
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(local_70,count,&local_78);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(&this->m_data,local_70)
    ;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(local_70);
    if (param_7 == '\0') {
      lVar14 = data + 4;
      bVar11 = true;
      pfVar8 = (this->m_data).ptr;
      iVar4 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
      while (bVar11) {
        if (param_6 == '\0') {
          fVar22 = 1.0 / ((this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x *
                         (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y);
        }
        else {
          dVar23 = 0.0;
          uVar12 = 0;
          for (uVar15 = 0; uVar15 != iVar4 - 1; uVar15 = uVar15 + 1) {
            lVar19 = data + uVar12 * 4;
            lVar7 = lVar14 + ((long)(int)xSize + uVar12) * 4;
            for (lVar18 = 0; (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x + -1 != (int)lVar18;
                lVar18 = lVar18 + 1) {
              dVar23 = dVar23 + (double)((*(float *)(lVar19 + lVar18 * 4) +
                                          *(float *)(lVar19 + 4 + lVar18 * 4) +
                                          *(float *)(lVar7 + -4 + lVar18 * 4) +
                                         *(float *)(lVar7 + lVar18 * 4)) * 0.25);
            }
            uVar12 = (ulong)((int)uVar12 + xSize);
          }
          fVar22 = (float)(1.0 / dVar23);
        }
        for (uVar12 = 0; count != uVar12; uVar12 = uVar12 + 1) {
          pfVar8[uVar12] = fVar22 * *(float *)(data + uVar12 * 4);
        }
        lVar14 = lVar14 + count * 4;
        data = data + count * 4;
        pfVar8 = pfVar8 + count;
        bVar11 = false;
      }
    }
    else {
      uVar3 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
      local_78.memoryResource = pstd::pmr::new_delete_resource();
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                (local_70,(ulong)uVar3,&local_78);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&this->m_marginal_cdf,local_70);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(local_70);
      local_78.memoryResource = pstd::pmr::new_delete_resource();
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                (local_70,count,&local_78);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&this->m_conditional_cdf,local_70);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(local_70);
      lVar14 = (long)(int)xSize;
      uVar3 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
      pfVar10 = (this->m_conditional_cdf).ptr;
      pfVar16 = (this->m_data).ptr;
      pfVar9 = (this->m_marginal_cdf).ptr;
      uVar5 = uVar3 - 1;
      pfVar8 = pfVar10 + lVar14 * 2;
      local_88 = pfVar10 + 1;
      bVar11 = true;
      pfVar13 = pfVar10 + lVar14;
      while (bVar11) {
        uVar6 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x - 1;
        pfVar17 = local_88;
        lVar19 = data;
        for (uVar12 = 0; uVar12 != (~((int)uVar3 >> 0x1f) & uVar3); uVar12 = uVar12 + 1) {
          auVar20 = ZEXT816(0);
          pfVar10[uVar12 * lVar14] = 0.0;
          for (lVar7 = 0; (~((int)uVar6 >> 0x1f) & uVar6) != (uint)lVar7; lVar7 = lVar7 + 1) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *(ulong *)(lVar19 + lVar7 * 4);
            auVar21 = vcvtps2pd_avx(auVar2);
            auVar24._0_8_ = auVar21._0_8_ + auVar21._8_8_;
            auVar24._8_8_ = auVar21._0_8_ + auVar21._8_8_;
            auVar20 = vfmadd231sd_fma(auVar20,auVar24,ZEXT816(0x3fe0000000000000));
            pfVar17[lVar7] = (float)auVar20._0_8_;
          }
          pfVar17 = pfVar17 + lVar14;
          lVar19 = lVar19 + lVar14 * 4;
        }
        *pfVar9 = 0.0;
        auVar20 = ZEXT816(0);
        lVar19 = -1;
        for (uVar12 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != uVar12; uVar12 = uVar12 + 1) {
          pfVar17 = pfVar13 + lVar19;
          pfVar1 = pfVar8 + lVar19;
          lVar19 = lVar19 + lVar14;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = (double)*pfVar17 + (double)*pfVar1;
          auVar20 = vfmadd231sd_fma(auVar20,auVar25,ZEXT816(0x3fe0000000000000));
          pfVar9[uVar12 + 1] = (float)auVar20._0_8_;
        }
        fVar22 = 1.0 / pfVar9[(int)uVar5];
        for (uVar12 = 0; count != uVar12; uVar12 = uVar12 + 1) {
          pfVar10[uVar12] = fVar22 * pfVar10[uVar12];
        }
        for (lVar19 = 0; (int)uVar3 != lVar19; lVar19 = lVar19 + 1) {
          pfVar9[lVar19] = fVar22 * pfVar9[lVar19];
        }
        for (uVar12 = 0; count != uVar12; uVar12 = uVar12 + 1) {
          pfVar16[uVar12] = fVar22 * *(float *)(data + uVar12 * 4);
        }
        pfVar9 = pfVar9 + (int)uVar3;
        bVar11 = false;
        local_88 = local_88 + count;
        pfVar10 = pfVar10 + count;
        data = data + count * 4;
        pfVar8 = pfVar8 + count;
        pfVar13 = pfVar13 + count;
        pfVar16 = pfVar16 + count;
      }
    }
    return;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
           ,0x589,"PiecewiseLinear2D: build_cdf implies normalize=true");
}

Assistant:

PiecewiseLinear2D(Allocator alloc, const float *data, int xSize, int ySize,
                      pstd::array<int, Dimension> param_res = {},
                      pstd::array<const float *, Dimension> param_values = {},
                      bool normalize = true, bool build_cdf = true)
        : m_size(xSize, ySize),
          m_patch_size(1.f / (xSize - 1), 1.f / (ySize - 1)),
          m_inv_patch_size(m_size - Vector2i(1, 1)),
          m_param_values(alloc),
          m_data(alloc),
          m_marginal_cdf(alloc),
          m_conditional_cdf(alloc) {
        if (build_cdf && !normalize)
            LOG_FATAL("PiecewiseLinear2D: build_cdf implies normalize=true");

        /* Keep track of the dependence on additional parameters (optional) */
        uint32_t slices = 1;
        for (int i = 0; i < ArraySize; ++i)
            m_param_values.emplace_back(alloc);
        for (int i = (int)Dimension - 1; i >= 0; --i) {
            if (param_res[i] < 1)
                LOG_FATAL("PiecewiseLinear2D(): parameter resolution must be >= 1!");

            m_param_size[i] = param_res[i];
            m_param_values[i] = FloatStorage(param_res[i]);
            memcpy(m_param_values[i].data(), param_values[i],
                   sizeof(float) * param_res[i]);
            m_param_strides[i] = param_res[i] > 1 ? slices : 0;
            slices *= m_param_size[i];
        }

        uint32_t n_values = xSize * ySize;

        m_data = FloatStorage(slices * n_values);

        if (build_cdf) {
            m_marginal_cdf = FloatStorage(slices * m_size.y);
            m_conditional_cdf = FloatStorage(slices * n_values);

            float *marginal_cdf = m_marginal_cdf.data(),
                  *conditional_cdf = m_conditional_cdf.data(), *data_out = m_data.data();

            for (uint32_t slice = 0; slice < slices; ++slice) {
                /* Construct conditional CDF */
                for (int y = 0; y < m_size.y; ++y) {
                    double sum = 0.0;
                    size_t i = y * xSize;
                    conditional_cdf[i] = 0.f;
                    for (int x = 0; x < m_size.x - 1; ++x, ++i) {
                        sum += .5 * ((double)data[i] + (double)data[i + 1]);
                        conditional_cdf[i + 1] = (float)sum;
                    }
                }

                /* Construct marginal CDF */
                marginal_cdf[0] = 0.f;
                double sum = 0.0;
                for (int y = 0; y < m_size.y - 1; ++y) {
                    sum += .5 * ((double)conditional_cdf[(y + 1) * xSize - 1] +
                                 (double)conditional_cdf[(y + 2) * xSize - 1]);
                    marginal_cdf[y + 1] = (float)sum;
                }

                /* Normalize CDFs and PDF (if requested) */
                float normalization = 1.f / marginal_cdf[m_size.y - 1];
                for (size_t i = 0; i < n_values; ++i)
                    conditional_cdf[i] *= normalization;
                for (size_t i = 0; i < m_size.y; ++i)
                    marginal_cdf[i] *= normalization;
                for (size_t i = 0; i < n_values; ++i)
                    data_out[i] = data[i] * normalization;

                marginal_cdf += m_size.y;
                conditional_cdf += n_values;
                data_out += n_values;
                data += n_values;
            }
        } else {
            float *data_out = m_data.data();

            for (uint32_t slice = 0; slice < slices; ++slice) {
                float normalization = 1.f / HProd(m_inv_patch_size);
                if (normalize) {
                    double sum = 0.0;
                    for (uint32_t y = 0; y < m_size.y - 1; ++y) {
                        size_t i = y * xSize;
                        for (uint32_t x = 0; x < m_size.x - 1; ++x, ++i) {
                            float v00 = data[i], v10 = data[i + 1], v01 = data[i + xSize],
                                  v11 = data[i + 1 + xSize],
                                  avg = .25f * (v00 + v10 + v01 + v11);
                            sum += (double)avg;
                        }
                    }
                    normalization = float(1.0 / sum);
                }

                for (uint32_t k = 0; k < n_values; ++k)
                    data_out[k] = data[k] * normalization;

                data += n_values;
                data_out += n_values;
            }
        }
    }